

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O1

void internal_destroy_instance(AMQP_TRANSPORT_INSTANCE *instance)

{
  LIST_ITEM_HANDLE item_handle;
  void *deviceHandle;
  
  instance->state = AMQP_TRANSPORT_STATE_BEING_DESTROYED;
  if (instance->registered_devices != (SINGLYLINKEDLIST_HANDLE)0x0) {
    item_handle = singlylinkedlist_get_head_item(instance->registered_devices);
    while (item_handle != (LIST_ITEM_HANDLE)0x0) {
      deviceHandle = singlylinkedlist_item_get_value(item_handle);
      item_handle = singlylinkedlist_get_next_item(item_handle);
      IoTHubTransport_AMQP_Common_Unregister(deviceHandle);
    }
    singlylinkedlist_destroy(instance->registered_devices);
  }
  if (instance->amqp_connection != (AMQP_CONNECTION_HANDLE)0x0) {
    amqp_connection_destroy(instance->amqp_connection);
  }
  if (instance->tls_io != (XIO_HANDLE)0x0) {
    xio_destroy(instance->tls_io);
    instance->tls_io = (XIO_HANDLE)0x0;
  }
  if (instance->saved_tls_options != (OPTIONHANDLER_HANDLE)0x0) {
    OptionHandler_Destroy(instance->saved_tls_options);
    instance->saved_tls_options = (OPTIONHANDLER_HANDLE)0x0;
  }
  retry_control_destroy(instance->connection_retry_control);
  STRING_delete(instance->iothub_host_fqdn);
  free_proxy_data(instance);
  free(instance);
  return;
}

Assistant:

static void internal_destroy_instance(AMQP_TRANSPORT_INSTANCE* instance)
{
    if (instance != NULL)
    {
        update_state(instance, AMQP_TRANSPORT_STATE_BEING_DESTROYED);

        if (instance->registered_devices != NULL)
        {
            LIST_ITEM_HANDLE list_item = singlylinkedlist_get_head_item(instance->registered_devices);

            while (list_item != NULL)
            {
                AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)singlylinkedlist_item_get_value(list_item);
                list_item = singlylinkedlist_get_next_item(list_item);
                IoTHubTransport_AMQP_Common_Unregister(registered_device);
            }

            singlylinkedlist_destroy(instance->registered_devices);
        }

        if (instance->amqp_connection != NULL)
        {
            amqp_connection_destroy(instance->amqp_connection);
        }

        destroy_underlying_io_transport(instance);
        destroy_underlying_io_transport_options(instance);
        retry_control_destroy(instance->connection_retry_control);

        STRING_delete(instance->iothub_host_fqdn);

        /* SRS_IOTHUBTRANSPORT_AMQP_COMMON_01_043: [ `IoTHubTransport_AMQP_Common_Destroy` shall free the stored proxy options. ]*/
        free_proxy_data(instance);

        free(instance);
    }
}